

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualToTests.cpp
# Opt level: O0

void __thiscall
IsNotEqualToIterableTests::~IsNotEqualToIterableTests(IsNotEqualToIterableTests *this)

{
  IsNotEqualToIterableTests *this_local;
  
  ~IsNotEqualToIterableTests(this);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::Not::EqualTo equal iterables fails", []() {
			AssertThat(ut11::Is::Not::EqualTo(std::vector<int>({ 1, 2, 3 }))(std::vector<int>({ 1, 2, 3 })), ut11::Is::Not::True);
		});

		Then("Is::Not::EqualTo not equal iterable succeeds", []() {
			AssertThat(ut11::Is::Not::EqualTo(std::vector<int>({ 1, 2, 7 }))(std::vector<int>({ 1, 2, 15 })), ut11::Is::True);
		});

		Then("Is::Not::EqualTo iterable is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Not::EqualTo(std::vector<int>({ 1, 2, 3 }))) >::value, ut11::Is::True);
		});

		Then("Is::Not::EqualTo not equal iterable has an error message", []() {
			AssertThat(ut11::Is::Not::EqualTo(std::vector<int>({ 1, 2, 3 })).GetErrorMessage(std::vector<int>({ 3, 2, 1 })), ut11::Is::Not::EqualTo(""));
		});
	}